

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.h
# Opt level: O2

void __thiscall apollonia::World::Add(World *this,Body *body)

{
  Body *local_8;
  
  local_8 = body;
  std::vector<apollonia::Body_*,_std::allocator<apollonia::Body_*>_>::push_back
            (&this->bodies_,&local_8);
  return;
}

Assistant:

void Add(Body* body) { bodies_.push_back(body); }